

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_New_Internal
                   (FT_Memory memory,FT_UInt numPoints,FT_Int numContours,FT_Outline *anoutline)

{
  FT_Vector *__s;
  char *__s_00;
  short *psVar1;
  ulong __n;
  int iVar2;
  int local_34 [2];
  FT_Error error;
  
  local_34[0] = 6;
  if (memory != (FT_Memory)0x0 && anoutline != (FT_Outline *)0x0) {
    anoutline->tags = (char *)0x0;
    anoutline->contours = (short *)0x0;
    anoutline->n_contours = 0;
    anoutline->n_points = 0;
    *(undefined4 *)&anoutline->field_0x4 = 0;
    anoutline->points = (FT_Vector *)0x0;
    *(undefined8 *)&anoutline->flags = 0;
    if (((uint)numContours <= numPoints && -1 < numContours) &&
       (local_34[0] = 10, numPoints < 0x8000)) {
      __n = (ulong)numPoints;
      if (numPoints == 0) {
        local_34[0] = 0;
        __s = (FT_Vector *)0x0;
      }
      else {
        __s = (FT_Vector *)(*memory->alloc)(memory,__n << 4);
        local_34[0] = (uint)(__s == (FT_Vector *)0x0) << 6;
        if ((__s == (FT_Vector *)0x0) == 0) {
          memset(__s,0,__n << 4);
        }
      }
      anoutline->points = __s;
      if (local_34[0] == 0) {
        if (numPoints == 0) {
          iVar2 = 0;
          __s_00 = (char *)0x0;
        }
        else {
          __s_00 = (char *)(*memory->alloc)(memory,__n);
          iVar2 = (uint)(__s_00 == (char *)0x0) << 6;
          if ((__s_00 == (char *)0x0) == 0) {
            memset(__s_00,0,__n);
          }
        }
        anoutline->tags = __s_00;
        local_34[0] = iVar2;
        if (iVar2 == 0) {
          psVar1 = (short *)ft_mem_realloc(memory,2,0,(ulong)(uint)numContours,(void *)0x0,local_34)
          ;
          anoutline->contours = psVar1;
          if (local_34[0] == 0) {
            anoutline->n_points = (short)numPoints;
            anoutline->n_contours = (short)numContours;
            *(byte *)&anoutline->flags = (byte)anoutline->flags | 1;
            return 0;
          }
        }
      }
      *(byte *)&anoutline->flags = (byte)anoutline->flags | 1;
      FT_Outline_Done_Internal(memory,anoutline);
    }
  }
  return local_34[0];
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_New_Internal( FT_Memory    memory,
                           FT_UInt      numPoints,
                           FT_Int       numContours,
                           FT_Outline  *anoutline )
  {
    FT_Error  error;


    if ( !anoutline || !memory )
      return FT_THROW( Invalid_Argument );

    *anoutline = null_outline;

    if ( numContours < 0                  ||
         (FT_UInt)numContours > numPoints )
      return FT_THROW( Invalid_Argument );

    if ( numPoints > FT_OUTLINE_POINTS_MAX )
      return FT_THROW( Array_Too_Large );

    if ( FT_NEW_ARRAY( anoutline->points,   numPoints   ) ||
         FT_NEW_ARRAY( anoutline->tags,     numPoints   ) ||
         FT_NEW_ARRAY( anoutline->contours, numContours ) )
      goto Fail;

    anoutline->n_points    = (FT_Short)numPoints;
    anoutline->n_contours  = (FT_Short)numContours;
    anoutline->flags      |= FT_OUTLINE_OWNER;

    return FT_Err_Ok;

  Fail:
    anoutline->flags |= FT_OUTLINE_OWNER;
    FT_Outline_Done_Internal( memory, anoutline );

    return error;
  }